

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.h
# Opt level: O0

__m256i * popcount256(__m256i v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  __m256i popcnt2;
  __m256i popcnt1;
  __m256i hi;
  __m256i lo;
  __m256i low_mask;
  __m256i lookupneg;
  __m256i lookuppos;
  undefined8 uStack_5c8;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  auVar1 = vpinsrb_avx(ZEXT116(4),5,1);
  auVar1 = vpinsrb_avx(auVar1,5,2);
  auVar1 = vpinsrb_avx(auVar1,6,3);
  auVar1 = vpinsrb_avx(auVar1,5,4);
  auVar1 = vpinsrb_avx(auVar1,6,5);
  auVar1 = vpinsrb_avx(auVar1,6,6);
  auVar1 = vpinsrb_avx(auVar1,7,7);
  auVar1 = vpinsrb_avx(auVar1,5,8);
  auVar1 = vpinsrb_avx(auVar1,6,9);
  auVar1 = vpinsrb_avx(auVar1,6,10);
  auVar1 = vpinsrb_avx(auVar1,7,0xb);
  auVar1 = vpinsrb_avx(auVar1,6,0xc);
  auVar1 = vpinsrb_avx(auVar1,7,0xd);
  auVar1 = vpinsrb_avx(auVar1,7,0xe);
  auVar1 = vpinsrb_avx(auVar1,8,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(4),5,1);
  auVar2 = vpinsrb_avx(auVar2,5,2);
  auVar2 = vpinsrb_avx(auVar2,6,3);
  auVar2 = vpinsrb_avx(auVar2,5,4);
  auVar2 = vpinsrb_avx(auVar2,6,5);
  auVar2 = vpinsrb_avx(auVar2,6,6);
  auVar2 = vpinsrb_avx(auVar2,7,7);
  auVar2 = vpinsrb_avx(auVar2,5,8);
  auVar2 = vpinsrb_avx(auVar2,6,9);
  auVar2 = vpinsrb_avx(auVar2,6,10);
  auVar2 = vpinsrb_avx(auVar2,7,0xb);
  auVar2 = vpinsrb_avx(auVar2,6,0xc);
  auVar2 = vpinsrb_avx(auVar2,7,0xd);
  auVar2 = vpinsrb_avx(auVar2,7,0xe);
  auVar2 = vpinsrb_avx(auVar2,8,0xf);
  uStack_d0 = auVar2._0_8_;
  uStack_c8 = auVar2._8_8_;
  auVar2 = vpinsrb_avx(ZEXT116(4),3,1);
  auVar2 = vpinsrb_avx(auVar2,3,2);
  auVar2 = vpinsrb_avx(auVar2,2,3);
  auVar2 = vpinsrb_avx(auVar2,3,4);
  auVar2 = vpinsrb_avx(auVar2,2,5);
  auVar2 = vpinsrb_avx(auVar2,2,6);
  auVar2 = vpinsrb_avx(auVar2,1,7);
  auVar2 = vpinsrb_avx(auVar2,3,8);
  auVar2 = vpinsrb_avx(auVar2,2,9);
  auVar2 = vpinsrb_avx(auVar2,2,10);
  auVar2 = vpinsrb_avx(auVar2,1,0xb);
  auVar2 = vpinsrb_avx(auVar2,2,0xc);
  auVar2 = vpinsrb_avx(auVar2,1,0xd);
  auVar2 = vpinsrb_avx(auVar2,1,0xe);
  auVar2 = vpinsrb_avx(auVar2,0,0xf);
  auVar10 = vpinsrb_avx(ZEXT116(4),3,1);
  auVar10 = vpinsrb_avx(auVar10,3,2);
  auVar10 = vpinsrb_avx(auVar10,2,3);
  auVar10 = vpinsrb_avx(auVar10,3,4);
  auVar10 = vpinsrb_avx(auVar10,2,5);
  auVar10 = vpinsrb_avx(auVar10,2,6);
  auVar10 = vpinsrb_avx(auVar10,1,7);
  auVar10 = vpinsrb_avx(auVar10,3,8);
  auVar10 = vpinsrb_avx(auVar10,2,9);
  auVar10 = vpinsrb_avx(auVar10,2,10);
  auVar10 = vpinsrb_avx(auVar10,1,0xb);
  auVar10 = vpinsrb_avx(auVar10,2,0xc);
  auVar10 = vpinsrb_avx(auVar10,1,0xd);
  auVar10 = vpinsrb_avx(auVar10,1,0xe);
  auVar10 = vpinsrb_avx(auVar10,0,0xf);
  uStack_90 = auVar10._0_8_;
  uStack_88 = auVar10._8_8_;
  auVar10 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar10 = vpinsrb_avx(auVar10,0xf,2);
  auVar10 = vpinsrb_avx(auVar10,0xf,3);
  auVar10 = vpinsrb_avx(auVar10,0xf,4);
  auVar10 = vpinsrb_avx(auVar10,0xf,5);
  auVar10 = vpinsrb_avx(auVar10,0xf,6);
  auVar10 = vpinsrb_avx(auVar10,0xf,7);
  auVar10 = vpinsrb_avx(auVar10,0xf,8);
  auVar10 = vpinsrb_avx(auVar10,0xf,9);
  auVar10 = vpinsrb_avx(auVar10,0xf,10);
  auVar10 = vpinsrb_avx(auVar10,0xf,0xb);
  auVar10 = vpinsrb_avx(auVar10,0xf,0xc);
  auVar10 = vpinsrb_avx(auVar10,0xf,0xd);
  auVar10 = vpinsrb_avx(auVar10,0xf,0xe);
  auVar10 = vpinsrb_avx(auVar10,0xf,0xf);
  auVar9 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar9 = vpinsrb_avx(auVar9,0xf,2);
  auVar9 = vpinsrb_avx(auVar9,0xf,3);
  auVar9 = vpinsrb_avx(auVar9,0xf,4);
  auVar9 = vpinsrb_avx(auVar9,0xf,5);
  auVar9 = vpinsrb_avx(auVar9,0xf,6);
  auVar9 = vpinsrb_avx(auVar9,0xf,7);
  auVar9 = vpinsrb_avx(auVar9,0xf,8);
  auVar9 = vpinsrb_avx(auVar9,0xf,9);
  auVar9 = vpinsrb_avx(auVar9,0xf,10);
  auVar9 = vpinsrb_avx(auVar9,0xf,0xb);
  auVar9 = vpinsrb_avx(auVar9,0xf,0xc);
  auVar9 = vpinsrb_avx(auVar9,0xf,0xd);
  auVar9 = vpinsrb_avx(auVar9,0xf,0xe);
  auVar9 = vpinsrb_avx(auVar9,0xf,0xf);
  auVar9 = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar9;
  auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
  uStack_110 = auVar10._0_8_;
  uStack_108 = auVar10._8_8_;
  auVar4._8_8_ = in_stack_00000010;
  auVar4._0_8_ = in_stack_00000008;
  auVar4._16_8_ = in_stack_00000018;
  auVar4._24_8_ = in_stack_00000020;
  auVar3._16_8_ = uStack_110;
  auVar3._0_16_ = auVar9;
  auVar3._24_8_ = uStack_108;
  auVar3 = vpand_avx2(auVar4,auVar3);
  auVar6._8_8_ = in_stack_00000010;
  auVar6._0_8_ = in_stack_00000008;
  auVar6._16_8_ = in_stack_00000018;
  auVar6._24_8_ = in_stack_00000020;
  auVar4 = vpsrlw_avx2(auVar6,ZEXT416(4));
  auVar5._16_8_ = uStack_110;
  auVar5._0_16_ = auVar9;
  auVar5._24_8_ = uStack_108;
  auVar4 = vpand_avx2(auVar4,auVar5);
  auVar8._16_8_ = uStack_d0;
  auVar8._0_16_ = auVar1;
  auVar8._24_8_ = uStack_c8;
  auVar3 = vpshufb_avx2(auVar8,auVar3);
  auVar7._16_8_ = uStack_90;
  auVar7._0_16_ = auVar2;
  auVar7._24_8_ = uStack_88;
  auVar4 = vpshufb_avx2(auVar7,auVar4);
  uStack_5c8 = auVar3._24_8_;
  vpsadbw_avx2(auVar3,auVar4);
  return uStack_5c8;
}

Assistant:

CROARING_TARGET_AVX2
/**
 * Compute the population count of a 256-bit word
 * This is not especially fast, but it is convenient as part of other functions.
 */
static inline __m256i popcount256(__m256i v) {
    const __m256i lookuppos = _mm256_setr_epi8(
        /* 0 */ 4 + 0, /* 1 */ 4 + 1, /* 2 */ 4 + 1, /* 3 */ 4 + 2,
        /* 4 */ 4 + 1, /* 5 */ 4 + 2, /* 6 */ 4 + 2, /* 7 */ 4 + 3,
        /* 8 */ 4 + 1, /* 9 */ 4 + 2, /* a */ 4 + 2, /* b */ 4 + 3,
        /* c */ 4 + 2, /* d */ 4 + 3, /* e */ 4 + 3, /* f */ 4 + 4,

        /* 0 */ 4 + 0, /* 1 */ 4 + 1, /* 2 */ 4 + 1, /* 3 */ 4 + 2,
        /* 4 */ 4 + 1, /* 5 */ 4 + 2, /* 6 */ 4 + 2, /* 7 */ 4 + 3,
        /* 8 */ 4 + 1, /* 9 */ 4 + 2, /* a */ 4 + 2, /* b */ 4 + 3,
        /* c */ 4 + 2, /* d */ 4 + 3, /* e */ 4 + 3, /* f */ 4 + 4);
    const __m256i lookupneg = _mm256_setr_epi8(
        /* 0 */ 4 - 0, /* 1 */ 4 - 1, /* 2 */ 4 - 1, /* 3 */ 4 - 2,
        /* 4 */ 4 - 1, /* 5 */ 4 - 2, /* 6 */ 4 - 2, /* 7 */ 4 - 3,
        /* 8 */ 4 - 1, /* 9 */ 4 - 2, /* a */ 4 - 2, /* b */ 4 - 3,
        /* c */ 4 - 2, /* d */ 4 - 3, /* e */ 4 - 3, /* f */ 4 - 4,

        /* 0 */ 4 - 0, /* 1 */ 4 - 1, /* 2 */ 4 - 1, /* 3 */ 4 - 2,
        /* 4 */ 4 - 1, /* 5 */ 4 - 2, /* 6 */ 4 - 2, /* 7 */ 4 - 3,
        /* 8 */ 4 - 1, /* 9 */ 4 - 2, /* a */ 4 - 2, /* b */ 4 - 3,
        /* c */ 4 - 2, /* d */ 4 - 3, /* e */ 4 - 3, /* f */ 4 - 4);
    const __m256i low_mask = _mm256_set1_epi8(0x0f);

    const __m256i lo = _mm256_and_si256(v, low_mask);
    const __m256i hi = _mm256_and_si256(_mm256_srli_epi16(v, 4), low_mask);
    const __m256i popcnt1 = _mm256_shuffle_epi8(lookuppos, lo);
    const __m256i popcnt2 = _mm256_shuffle_epi8(lookupneg, hi);
    return _mm256_sad_epu8(popcnt1, popcnt2);
}